

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

Seq __thiscall xt::VSeq::next(VSeq *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  VSeq *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  int iVar2;
  bool bVar3;
  Seq SVar4;
  
  iVar2 = *(int *)(in_RSI + 0x18);
  peVar1 = *(element_type **)(in_RSI + 8);
  if (peVar1->cnt <= iVar2 + 1U) {
    (this->super_ISeq)._vptr_ISeq = (_func_int **)0x0;
    (this->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    goto LAB_00107bb5;
  }
  __p = (VSeq *)operator_new(0x20);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__p->super_ISeq)._vptr_ISeq = (_func_int **)&PTR_first_0010bb98;
    (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      bVar3 = __libc_single_threaded == '\0';
      iVar2 = *(int *)(in_RSI + 0x18);
      (__p->super_ISeq)._vptr_ISeq = (_func_int **)&PTR_first_0010bb98;
      (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
      if (bVar3) {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_00107b8f;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      iVar2 = *(int *)(in_RSI + 0x18);
      (__p->super_ISeq)._vptr_ISeq = (_func_int **)&PTR_first_0010bb98;
      (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_00107b8f:
  __p->index = iVar2 + 1;
  (this->super_ISeq)._vptr_ISeq = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::VSeq*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->v,__p);
  in_RDX._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX_00;
  }
LAB_00107bb5:
  SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq VSeq::next() const { if (index+1 < v->cnt) return Seq(new VSeq(v, index+1));  return Seq(); }